

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

AssertionResult __thiscall
testing::internal::CmpHelperSTREQ
          (internal *this,char *lhs_expression,char *rhs_expression,wchar_t *lhs,wchar_t *rhs)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  wchar_t **value;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_00;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_01;
  AssertionResult AVar2;
  wchar_t *local_68;
  wchar_t *local_60;
  string local_58;
  string local_38;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  value_00;
  
  value_00._M_head_impl._1_7_ = (undefined7)((ulong)rhs_expression >> 8);
  value_00._M_head_impl._0_1_ = rhs == (wchar_t *)0x0 || lhs == (wchar_t *)0x0;
  local_68 = rhs;
  local_60 = lhs;
  if (rhs == (wchar_t *)0x0 || lhs == (wchar_t *)0x0) {
    if (lhs != (wchar_t *)0x0 || rhs != (wchar_t *)0x0) {
LAB_0011d09b:
      PrintToString<wchar_t_const*>
                (&local_38,(testing *)&local_60,(wchar_t **)value_00._M_head_impl);
      PrintToString<wchar_t_const*>(&local_58,(testing *)&local_68,value);
      AVar2 = EqFailure(this,lhs_expression,rhs_expression,&local_38,&local_58,false);
      value_00._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           AVar2.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        value_00 = extraout_RDX_00.
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
        value_00._M_head_impl =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             extraout_RDX_01.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
      }
      goto LAB_0011d108;
    }
  }
  else {
    iVar1 = wcscmp(lhs,rhs);
    value_00._M_head_impl = extraout_RDX;
    if (iVar1 != 0) goto LAB_0011d09b;
  }
  *this = (internal)0x1;
  *(undefined8 *)(this + 8) = 0;
LAB_0011d108:
  AVar2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )value_00._M_head_impl;
  AVar2._0_8_ = this;
  return AVar2;
}

Assistant:

AssertionResult CmpHelperSTREQ(const char* lhs_expression,
                               const char* rhs_expression,
                               const wchar_t* lhs,
                               const wchar_t* rhs) {
  if (String::WideCStringEquals(lhs, rhs)) {
    return AssertionSuccess();
  }

  return EqFailure(lhs_expression,
                   rhs_expression,
                   PrintToString(lhs),
                   PrintToString(rhs),
                   false);
}